

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterClose(Fts5IndexIter *pIndexIter)

{
  Fts5Iter *in_RDI;
  Fts5Index *pIndex;
  Fts5Iter *pIter;
  
  if (in_RDI != (Fts5Iter *)0x0) {
    fts5TokendataIterDelete((Fts5TokenDataIter *)in_RDI);
    fts5MultiIterFree(in_RDI);
    fts5IndexCloseReader((Fts5Index *)in_RDI);
  }
  return;
}

Assistant:

static void fts5IterClose(Fts5IndexIter *pIndexIter){
  if( pIndexIter ){
    Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
    Fts5Index *pIndex = pIter->pIndex;
    fts5TokendataIterDelete(pIter->pTokenDataIter);
    fts5MultiIterFree(pIter);
    fts5IndexCloseReader(pIndex);
  }
}